

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O2

void __thiscall xmrig::OclLaunchStatus::print(OclLaunchStatus *this)

{
  size_t sVar1;
  size_t sVar2;
  uint64_t uVar3;
  char *pcVar4;
  
  sVar1 = this->m_started;
  if (sVar1 != 0) {
    pcVar4 = "\x1b[1;33m";
    if (this->m_errors == 0) {
      pcVar4 = "\x1b[1;36m";
    }
    sVar2 = this->m_threads;
    uVar3 = Chrono::steadyMSecs();
    Log::print(INFO,"%s\x1b[1;32m READY\x1b[0m threads %s%zu/%zu\x1b[1;30m (%lu ms)\x1b[0m",
               "\x1b[45;1m\x1b[1;37m ocl \x1b[0m",pcVar4,sVar1,sVar2,uVar3 - this->m_ts);
    return;
  }
  Log::print(ERR,"%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (failed to start threads)\x1b[0m",
             "\x1b[45;1m\x1b[1;37m ocl \x1b[0m");
  return;
}

Assistant:

inline void print() const
    {
        if (m_started == 0) {
            LOG_ERR("%s " RED_BOLD("disabled") YELLOW(" (failed to start threads)"), tag);

            return;
        }

        LOG_INFO("%s" GREEN_BOLD(" READY") " threads " "%s%zu/%zu" BLACK_BOLD(" (%" PRIu64 " ms)"),
                 tag,
                 m_errors == 0 ? CYAN_BOLD_S : YELLOW_BOLD_S,
                 m_started,
                 m_threads,
                 Chrono::steadyMSecs() - m_ts
                 );
    }